

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int archive_read_format_cpio_skip(archive_read *a)

{
  long lVar1;
  archive_read *a_00;
  archive_read *paVar2;
  long in_RDI;
  int64_t to_skip;
  cpio *cpio;
  undefined4 local_4;
  
  lVar1 = **(long **)(in_RDI + 0x948);
  a_00 = (archive_read *)
         (*(long *)(lVar1 + 0x18) + *(long *)(lVar1 + 0x30) + *(long *)(lVar1 + 0x20));
  paVar2 = (archive_read *)__archive_read_consume(a_00,(int64_t)a_00);
  if (a_00 == paVar2) {
    *(undefined8 *)(lVar1 + 0x18) = 0;
    *(undefined8 *)(lVar1 + 0x30) = 0;
    *(undefined8 *)(lVar1 + 0x20) = 0;
    local_4 = 0;
  }
  else {
    local_4 = -0x1e;
  }
  return local_4;
}

Assistant:

static int
archive_read_format_cpio_skip(struct archive_read *a)
{
	struct cpio *cpio = (struct cpio *)(a->format->data);
	int64_t to_skip = cpio->entry_bytes_remaining + cpio->entry_padding +
		cpio->entry_bytes_unconsumed;

	if (to_skip != __archive_read_consume(a, to_skip)) {
		return (ARCHIVE_FATAL);
	}
	cpio->entry_bytes_remaining = 0;
	cpio->entry_padding = 0;
	cpio->entry_bytes_unconsumed = 0;
	return (ARCHIVE_OK);
}